

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RectangularVolumeRecord3.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::RectangularVolumeRecord3::Encode
          (RectangularVolumeRecord3 *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  RectangularVolumeRecord3 *this_local;
  
  pKVar1 = KDataStream::operator<<(stream,(this->super_EnvironmentRecord).m_ui32EnvRecTyp);
  pKVar1 = KDataStream::operator<<(pKVar1,(this->super_EnvironmentRecord).m_ui16Length);
  pKVar1 = KDataStream::operator<<(pKVar1,(this->super_EnvironmentRecord).m_ui8Index);
  pKVar1 = KDataStream::operator<<(pKVar1,(this->super_EnvironmentRecord).m_ui8Padding);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,&(this->m_CentLocation).super_DataTypeBase);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,&(this->m_RecLength).super_DataTypeBase);
  DATA_TYPE::operator<<(pKVar1,&(this->m_Ori).super_DataTypeBase);
  return;
}

Assistant:

void RectangularVolumeRecord3::Encode( KDataStream & stream ) const
{
    stream << m_ui32EnvRecTyp
           << m_ui16Length
           << m_ui8Index
           << m_ui8Padding
           << KDIS_STREAM m_CentLocation
           << KDIS_STREAM m_RecLength
           << KDIS_STREAM m_Ori;
}